

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

znzFile nifti_write_ascii_image
                  (nifti_image *nim,nifti_brick_list *NBL,char *opts,int write_data,int leave_open)

{
  char *fname;
  int use_compression;
  char *str;
  znzFile file;
  znzFile fp;
  
  str = nifti_image_to_ascii(nim);
  if (str == (char *)0x0) {
    fwrite("** failed image_to_ascii()\n",0x1b,1,_stderr);
    file = (znzFile)0x0;
  }
  else {
    fname = nim->fname;
    use_compression = nifti_is_gzfile(fname);
    file = znzopen(fname,opts,use_compression);
    fp = file;
    if (file == (znzFile)0x0) {
      free(str);
      file = (znzFile)0x0;
      fprintf(_stderr,"** failed to open \'%s\' for ascii write\n",nim->fname);
    }
    else {
      znzputs(str,file);
      nifti_write_extensions(file,nim);
      if (write_data != 0) {
        nifti_write_all_data(file,nim,NBL);
      }
      if (leave_open == 0) {
        Xznzclose(&fp);
        file = fp;
      }
      free(str);
    }
  }
  return file;
}

Assistant:

znzFile nifti_write_ascii_image(nifti_image *nim, const nifti_brick_list * NBL,
                              const char *opts, int write_data, int leave_open)
{
   znzFile   fp;
   char    * hstr;

   hstr = nifti_image_to_ascii( nim ) ;  /* get header in ASCII form */
   if( ! hstr ){ fprintf(stderr,"** failed image_to_ascii()\n"); return NULL; }

   fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
   if( znz_isnull(fp) ){
      free(hstr);
      fprintf(stderr,"** failed to open '%s' for ascii write\n",nim->fname);
      return fp;
   }

   znzputs(hstr,fp);                                               /* header */
   nifti_write_extensions(fp,nim);                             /* extensions */

   if ( write_data   ) { nifti_write_all_data(fp,nim,NBL); }         /* data */
   if ( ! leave_open ) { znzclose(fp); }
   free(hstr);
   return fp;  /* returned but may be closed */
}